

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::NeuralNetworkRegressor::Clear(NeuralNetworkRegressor *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
            (&(this->preprocessing_).super_RepeatedPtrFieldBase);
  if (this->updateparams_ != (NetworkUpdateParameters *)0x0) {
    (*(this->updateparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->updateparams_ = (NetworkUpdateParameters *)0x0;
  this->arrayinputshapemapping_ = 0;
  this->imageinputshapemapping_ = 0;
  return;
}

Assistant:

void NeuralNetworkRegressor::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NeuralNetworkRegressor)
  layers_.Clear();
  preprocessing_.Clear();
  if (GetArenaNoVirtual() == NULL && updateparams_ != NULL) {
    delete updateparams_;
  }
  updateparams_ = NULL;
  ::memset(&arrayinputshapemapping_, 0, reinterpret_cast<char*>(&imageinputshapemapping_) -
    reinterpret_cast<char*>(&arrayinputshapemapping_) + sizeof(imageinputshapemapping_));
}